

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack23_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [32];
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  uVar1 = *(ulong *)(in + 9);
  uVar2 = *(ulong *)(in + 0xb);
  auVar10 = vpmovsxbq_avx(ZEXT216(0x500));
  auVar3 = *(undefined1 (*) [32])(in + 1);
  auVar12 = vpmovsxbd_avx512f(_DAT_00199a60);
  uVar4 = *in;
  uVar6 = *(ulong *)(in + 0xe);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar9 = vpsllvd_avx2(auVar17,_DAT_001999a0);
  auVar7 = vpsllvd_avx2(auVar3,_DAT_001965c0);
  auVar11._8_4_ = 0x7ff000;
  auVar11._0_8_ = 0x600000007ff000;
  auVar11._12_4_ = 0x600000;
  auVar9 = vpandq_avx512vl(auVar9,auVar11);
  auVar7 = vpand_avx2(auVar7,_DAT_001965e0);
  *out = uVar4 & 0x7fffff;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar2;
  auVar10 = vpermi2d_avx512vl(auVar10,auVar19,auVar17);
  auVar10 = vpsrlvd_avx2(auVar10,_DAT_001999d0);
  auVar12 = vpermi2d_avx512f(auVar12,ZEXT3264(auVar3),ZEXT464(uVar4));
  auVar13 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1;
  auVar12 = vinserti32x4_avx512f(auVar12,auVar18,3);
  auVar14 = vpmovsxbd_avx512f(_DAT_00199a70);
  auVar10 = vpblendd_avx2(auVar9,auVar10,0xc);
  auVar9 = vpsllvd_avx2(auVar19,_DAT_001999e0);
  auVar12 = vpermi2q_avx512f(auVar13,auVar12,ZEXT1664(auVar9));
  auVar13 = vpermd_avx512f(auVar14,auVar12);
  auVar13 = vpsrlvd_avx512f(auVar13,_DAT_001a98c0);
  auVar14 = vmovdqa64_avx512f(auVar13);
  auVar12 = vpandd_avx512f(auVar12,_DAT_001a9900);
  auVar14._56_4_ = auVar12._56_4_;
  auVar14._60_4_ = auVar12._60_4_;
  auVar12 = vpmovsxbd_avx512f(_DAT_00199a80);
  uVar5 = in[0xd];
  auVar12 = vpermi2d_avx512f(auVar12,ZEXT3264(auVar7),ZEXT1664(auVar10));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar2;
  auVar10 = vpshufd_avx(auVar20,0x55);
  auVar10 = vpinsrd_avx(auVar10,uVar5,2);
  auVar14 = vpord_avx512f(auVar14,auVar12);
  auVar12._8_4_ = 0x7fffff;
  auVar12._0_8_ = 0x7fffff007fffff;
  auVar12._12_4_ = 0x7fffff;
  auVar12._16_4_ = 0x7fffff;
  auVar12._20_4_ = 0x7fffff;
  auVar12._24_4_ = 0x7fffff;
  auVar12._28_4_ = 0x7fffff;
  auVar12._32_4_ = 0x7fffff;
  auVar12._36_4_ = 0x7fffff;
  auVar12._40_4_ = 0x7fffff;
  auVar12._44_4_ = 0x7fffff;
  auVar12._48_4_ = 0x7fffff;
  auVar12._52_4_ = 0x7fffff;
  auVar12._56_4_ = 0x7fffff;
  auVar12._60_4_ = 0x7fffff;
  auVar12 = vpandd_avx512f(auVar13,auVar12);
  auVar13._0_8_ = auVar14._0_8_;
  auVar13._8_4_ = auVar12._8_4_;
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._16_4_ = auVar14._16_4_;
  auVar13._20_4_ = auVar14._20_4_;
  auVar13._24_4_ = auVar12._24_4_;
  auVar13._28_4_ = auVar14._28_4_;
  auVar13._32_4_ = auVar14._32_4_;
  auVar13._36_4_ = auVar12._36_4_;
  auVar13._40_4_ = auVar14._40_4_;
  auVar13._44_4_ = auVar14._44_4_;
  auVar13._48_4_ = auVar14._48_4_;
  auVar13._52_4_ = auVar12._52_4_;
  auVar13._56_4_ = auVar14._56_4_;
  auVar13._60_4_ = auVar14._60_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(0x4020000));
  auVar12 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])(out + 1) = auVar12;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar6;
  auVar11 = vpsllvd_avx2(auVar15,_DAT_0019a580);
  auVar10 = vpermi2d_avx512vl(auVar9,auVar10,auVar15);
  auVar8 = vpsrlvd_avx2(auVar10,_DAT_001a6f10);
  auVar10._8_4_ = 0x7ff800;
  auVar10._0_8_ = 0x700000007ff800;
  auVar10._12_4_ = 0x700000;
  auVar11 = vpandq_avx512vl(auVar11,auVar10);
  auVar9 = vpinsrd_avx(ZEXT416(0x7fffff),uVar5 * 4 & 0x7ffffc,1);
  auVar10 = vpand_avx(auVar8,ZEXT416(0x7fffff));
  auVar9 = vpunpcklqdq_avx(auVar9,auVar11);
  auVar9 = vpor_avx(auVar8,auVar9);
  auVar9 = vpblendd_avx2(auVar9,auVar10,1);
  auVar10 = vpmovsxbd_avx(ZEXT416(0x401));
  *(undefined1 (*) [16])(out + 0x11) = auVar9;
  uVar1 = *(ulong *)(in + 0x10);
  out[0x15] = (uint)(uVar6 >> 0x23) & 0x7fffff;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar6;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar10 = vpermi2d_avx512vl(auVar10,auVar9,auVar16);
  auVar9 = vpsrlvd_avx2(auVar10,_DAT_001a6f20);
  auVar10 = vpsllvd_avx2(auVar16,_DAT_0019a590);
  auVar8._8_4_ = 0x7fffc0;
  auVar8._0_8_ = 0x7f8000007fffc0;
  auVar8._12_4_ = 0x7f8000;
  auVar10 = vpternlogq_avx512vl(auVar10,auVar9,auVar8,0xec);
  *(long *)(out + 0x16) = auVar10._0_8_;
  return in + 0x12;
}

Assistant:

const uint32_t *__fastunpack23_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 14)) << (23 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 5)) << (23 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 23);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 19)) << (23 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 10)) << (23 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 1)) << (23 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 23);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 15)) << (23 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 6)) << (23 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 23);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 20)) << (23 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 11)) << (23 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 2)) << (23 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 23);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 16)) << (23 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 7)) << (23 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 23);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 21)) << (23 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 12)) << (23 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 3)) << (23 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 23);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 17)) << (23 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 8)) << (23 - 8);
  out++;

  return in + 1;
}